

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ldf_asi(DisasContext_conflict8 *dc,TCGv_i32 addr,int insn,int size,int rd)

{
  TCGContext_conflict8 *tcg_ctx_00;
  TCGv_i64 arg2;
  TCGv_i32 pTVar1;
  TCGv_i32 arg4;
  TCGv_i32 ret;
  TCGv_i32 pTVar2;
  DisasASI DVar3;
  TCGv_i32 r_mop;
  TCGv_i32 r_asi;
  int i;
  TCGv_i32 eight;
  MemOp_conflict1 memop;
  TCGv_i32 d64;
  TCGv_i32 d32;
  DisasASI da;
  TCGContext_conflict8 *tcg_ctx;
  int rd_local;
  int size_local;
  int insn_local;
  TCGv_i32 addr_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  DVar3 = get_asi(dc,insn,size == 4 ^ MO_BEQ);
  d32._0_4_ = DVar3.type;
  da.asi = DVar3.memop;
  da.type = DVar3.mem_idx;
  switch((ASIType)d32) {
  case GET_ASI_EXCP:
    break;
  case GET_ASI_DIRECT:
    gen_address_mask(dc,addr);
    if (size == 4) {
      pTVar1 = gen_dest_fpr_F(dc);
      tcg_gen_qemu_ld_i32_sparc64(tcg_ctx_00,pTVar1,(TCGv_i64)addr,(long)(int)da.type,da.asi);
      gen_store_fpr_F(dc,rd,pTVar1);
    }
    else if (size == 8) {
      tcg_gen_qemu_ld_i64_sparc64
                (tcg_ctx_00,tcg_ctx_00->cpu_fpr[rd / 2],(TCGv_i64)addr,(long)(int)da.type,
                 da.asi | MO_ALIGN_4);
    }
    else {
      if (size != 0x10) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                   ,0x9e4,(char *)0x0);
      }
      pTVar1 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_qemu_ld_i64_sparc64
                (tcg_ctx_00,(TCGv_i64)pTVar1,(TCGv_i64)addr,(long)(int)da.type,da.asi | MO_ALIGN_4);
      tcg_gen_addi_i64_sparc64(tcg_ctx_00,(TCGv_i64)addr,(TCGv_i64)addr,8);
      tcg_gen_qemu_ld_i64_sparc64
                (tcg_ctx_00,tcg_ctx_00->cpu_fpr[rd / 2 + 1],(TCGv_i64)addr,(long)(int)da.type,
                 da.asi | MO_ALIGN_4);
      tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fpr[rd / 2],pTVar1);
      tcg_temp_free_i64(tcg_ctx_00,pTVar1);
    }
    break;
  default:
    d32._4_4_ = DVar3.asi;
    pTVar1 = tcg_const_i32_sparc64(tcg_ctx_00,d32._4_4_);
    arg4 = tcg_const_i32_sparc64(tcg_ctx_00,da.asi);
    save_state(dc);
    if (size == 4) {
      pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
      gen_helper_ld_asi(tcg_ctx_00,pTVar2,tcg_ctx_00->cpu_env,addr,pTVar1,arg4);
      ret = gen_dest_fpr_F(dc);
      tcg_gen_extrl_i64_i32_sparc64(tcg_ctx_00,ret,(TCGv_i64)pTVar2);
      tcg_temp_free_i64(tcg_ctx_00,pTVar2);
      gen_store_fpr_F(dc,rd,ret);
    }
    else if (size == 8) {
      gen_helper_ld_asi(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fpr[rd / 2],tcg_ctx_00->cpu_env,addr,
                        pTVar1,arg4);
    }
    else {
      if (size != 0x10) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                   ,0xa2c,(char *)0x0);
      }
      pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
      gen_helper_ld_asi(tcg_ctx_00,pTVar2,tcg_ctx_00->cpu_env,addr,pTVar1,arg4);
      tcg_gen_addi_i64_sparc64(tcg_ctx_00,(TCGv_i64)addr,(TCGv_i64)addr,8);
      gen_helper_ld_asi(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fpr[rd / 2 + 1],tcg_ctx_00->cpu_env,
                        addr,pTVar1,arg4);
      tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fpr[rd / 2],pTVar2);
      tcg_temp_free_i64(tcg_ctx_00,pTVar2);
    }
    tcg_temp_free_i32(tcg_ctx_00,arg4);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    break;
  case GET_ASI_BLOCK:
    if ((size == 8) && ((rd & 7U) == 0)) {
      gen_address_mask(dc,addr);
      eight._4_4_ = da.asi | MO_ALIGN_64;
      arg2 = tcg_const_i64_sparc64(tcg_ctx_00,8);
      for (r_asi._4_4_ = 0;
          tcg_gen_qemu_ld_i64_sparc64
                    (tcg_ctx_00,tcg_ctx_00->cpu_fpr[rd / 2 + r_asi._4_4_],(TCGv_i64)addr,
                     (long)(int)da.type,eight._4_4_), r_asi._4_4_ != 7;
          r_asi._4_4_ = r_asi._4_4_ + 1) {
        tcg_gen_add_i64(tcg_ctx_00,addr,addr,(TCGv_i32)arg2);
        eight._4_4_ = da.asi;
      }
      tcg_temp_free_i64(tcg_ctx_00,(TCGv_i32)arg2);
    }
    else {
      gen_exception(dc,0x10);
    }
    break;
  case GET_ASI_SHORT:
    if (size == 8) {
      gen_address_mask(dc,addr);
      tcg_gen_qemu_ld_i64_sparc64
                (tcg_ctx_00,tcg_ctx_00->cpu_fpr[rd / 2],(TCGv_i64)addr,(long)(int)da.type,da.asi);
    }
    else {
      gen_exception(dc,0x10);
    }
  }
  return;
}

Assistant:

static void gen_ldf_asi(DisasContext *dc, TCGv addr,
                        int insn, int size, int rd)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    DisasASI da = get_asi(dc, insn, (size == 4 ? MO_TEUL : MO_TEQ));
    TCGv_i32 d32;
    TCGv_i64 d64;

    switch (da.type) {
    case GET_ASI_EXCP:
        break;

    case GET_ASI_DIRECT:
        gen_address_mask(dc, addr);
        switch (size) {
        case 4:
            d32 = gen_dest_fpr_F(dc);
            tcg_gen_qemu_ld_i32(tcg_ctx, d32, addr, da.mem_idx, da.memop);
            gen_store_fpr_F(dc, rd, d32);
            break;
        case 8:
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], addr, da.mem_idx,
                                da.memop | MO_ALIGN_4);
            break;
        case 16:
            d64 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_qemu_ld_i64(tcg_ctx, d64, addr, da.mem_idx, da.memop | MO_ALIGN_4);
            tcg_gen_addi_tl(tcg_ctx, addr, addr, 8);
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd/2+1], addr, da.mem_idx,
                                da.memop | MO_ALIGN_4);
            tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], d64);
            tcg_temp_free_i64(tcg_ctx, d64);
            break;
        default:
            g_assert_not_reached();
        }
        break;

    case GET_ASI_BLOCK:
        /* Valid for lddfa on aligned registers only.  */
        if (size == 8 && (rd & 7) == 0) {
            MemOp memop;
            TCGv eight;
            int i;

            gen_address_mask(dc, addr);

            /* The first operation checks required alignment.  */
            memop = da.memop | MO_ALIGN_64;
            eight = tcg_const_tl(tcg_ctx, 8);
            for (i = 0; ; ++i) {
                tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2 + i], addr,
                                    da.mem_idx, memop);
                if (i == 7) {
                    break;
                }
                tcg_gen_add_tl(tcg_ctx, addr, addr, eight);
                memop = da.memop;
            }
            tcg_temp_free(tcg_ctx, eight);
        } else {
            gen_exception(dc, TT_ILL_INSN);
        }
        break;

    case GET_ASI_SHORT:
        /* Valid for lddfa only.  */
        if (size == 8) {
            gen_address_mask(dc, addr);
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], addr, da.mem_idx, da.memop);
        } else {
            gen_exception(dc, TT_ILL_INSN);
        }
        break;

    default:
        {
            TCGv_i32 r_asi = tcg_const_i32(tcg_ctx, da.asi);
            TCGv_i32 r_mop = tcg_const_i32(tcg_ctx, da.memop);

            save_state(dc);
            /* According to the table in the UA2011 manual, the only
               other asis that are valid for ldfa/lddfa/ldqfa are
               the NO_FAULT asis.  We still need a helper for these,
               but we can just use the integer asi helper for them.  */
            switch (size) {
            case 4:
                d64 = tcg_temp_new_i64(tcg_ctx);
                gen_helper_ld_asi(tcg_ctx, d64, tcg_ctx->cpu_env, addr, r_asi, r_mop);
                d32 = gen_dest_fpr_F(dc);
                tcg_gen_extrl_i64_i32(tcg_ctx, d32, d64);
                tcg_temp_free_i64(tcg_ctx, d64);
                gen_store_fpr_F(dc, rd, d32);
                break;
            case 8:
                gen_helper_ld_asi(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], tcg_ctx->cpu_env, addr, r_asi, r_mop);
                break;
            case 16:
                d64 = tcg_temp_new_i64(tcg_ctx);
                gen_helper_ld_asi(tcg_ctx, d64, tcg_ctx->cpu_env, addr, r_asi, r_mop);
                tcg_gen_addi_tl(tcg_ctx, addr, addr, 8);
                gen_helper_ld_asi(tcg_ctx, tcg_ctx->cpu_fpr[rd/2+1], tcg_ctx->cpu_env, addr, r_asi, r_mop);
                tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], d64);
                tcg_temp_free_i64(tcg_ctx, d64);
                break;
            default:
                g_assert_not_reached();
            }
            tcg_temp_free_i32(tcg_ctx, r_mop);
            tcg_temp_free_i32(tcg_ctx, r_asi);
        }
        break;
    }
}